

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclKernel.cpp
# Opt level: O1

void __thiscall xmrig::OclKernel::setArg(OclKernel *this,uint32_t index,size_t size,void *value)

{
  cl_int ret;
  char *pcVar1;
  char *pcVar2;
  runtime_error *this_00;
  
  ret = OclLib::setKernelArg(this->m_kernel,index,size,value);
  if (ret == 0) {
    return;
  }
  pcVar1 = ocl_tag();
  pcVar2 = OclError::toString(ret);
  Log::print(ERR,
             "%s\x1b[0;31m error \x1b[0m\x1b[1;31m%s\x1b[0m\x1b[0;31m when calling \x1b[0m\x1b[1;31mclSetKernelArg\x1b[0m\x1b[0;31m for kernel \x1b[0m\x1b[1;31m%s\x1b[0m\x1b[0;31m argument \x1b[0m\x1b[1;31m%u\x1b[0m\x1b[0;31m size \x1b[0m\x1b[1;31m%zu\x1b[0m"
             ,pcVar1,pcVar2,(this->m_name).m_data,index,size);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  pcVar1 = OclError::toString(ret);
  std::runtime_error::runtime_error(this_00,pcVar1);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void xmrig::OclKernel::setArg(uint32_t index, size_t size, const void *value)
{
    const cl_int ret = OclLib::setKernelArg(m_kernel, index, size, value);
    if (ret != CL_SUCCESS) {
        LOG_ERR("%s" RED(" error ") RED_BOLD("%s") RED(" when calling ") RED_BOLD("clSetKernelArg") RED(" for kernel ") RED_BOLD("%s")
                RED(" argument ") RED_BOLD("%u") RED(" size ") RED_BOLD("%zu"),
                ocl_tag(), OclError::toString(ret), name().data(), index, size);

        throw std::runtime_error(OclError::toString(ret));
    }
}